

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O1

int Cbs_ManPropagate(Cbs_Man_t *p,int Level)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  Gia_Obj_t **ppGVar9;
  ulong uVar10;
  Gia_Obj_t *pGVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  Gia_Obj_t *pGVar18;
  uint uVar19;
  
  do {
    iVar15 = (p->pProp).iHead;
    lVar16 = (long)iVar15;
    uVar6 = (p->pProp).iTail;
    uVar10 = (ulong)uVar6;
    if (iVar15 < (int)uVar6) {
      do {
        uVar6 = (uint)uVar10;
        pGVar2 = (p->pProp).pData[lVar16];
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        if (((ulong)pGVar2 & 1) != 0) {
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                        ,0x2ed,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        uVar10 = *(ulong *)pGVar2;
        uVar6 = (uint)uVar10;
        if ((uVar6 >> 0x1e & 1) == 0) {
          __assert_fail("Cbs_VarIsAssigned(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                        ,0x2ee,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        iVar15 = 0;
        if ((~uVar6 & 0x9fffffff) != 0) {
          if (((int)uVar6 < 0) || (uVar4 = uVar6 & 0x1fffffff, uVar4 == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x2f1,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
          }
          uVar13 = *(ulong *)(pGVar2 + -(ulong)uVar4);
          uVar14 = ((uint)(uVar10 >> 0x1d) & 7 ^ (uint)(uVar13 >> 0x3e)) & 1;
          uVar5 = (uint)uVar13;
          if ((uVar13 & 0x40000000) == 0) {
            uVar14 = 2;
          }
          uVar19 = (uint)(uVar10 >> 0x20);
          uVar13 = (ulong)(uVar19 & 0x1fffffff);
          uVar17 = (uint)*(undefined8 *)(pGVar2 + -uVar13);
          uVar19 = (uVar19 >> 0x1d ^ (uint)((ulong)*(undefined8 *)(pGVar2 + -uVar13) >> 0x3e)) & 1;
          if ((uVar17 >> 0x1e & 1) == 0) {
            uVar19 = 2;
          }
          if ((uVar6 >> 0x1e & 1) == 0) goto LAB_00712962;
          pGVar12 = pGVar2 + -(ulong)uVar4;
          pGVar18 = pGVar2 + -uVar13;
          if ((uVar10 & 0x4000000000000000) == 0) {
            if (uVar19 != 0 && uVar14 != 0) {
              if ((uVar14 == 1) && (uVar19 == 1)) goto LAB_007126fc;
              if ((uVar14 == 1) || (uVar19 == 1)) {
                if ((uVar5 >> 0x1e & 1) == 0) {
                  Cbs_ManAssign(p,(Gia_Obj_t *)(((ulong)(uVar6 >> 0x1d & 1) | (ulong)pGVar12) ^ 1),
                                Level,pGVar2,pGVar18);
                }
                iVar15 = 0;
                if ((uVar17 >> 0x1e & 1) == 0) {
                  uVar10 = *(ulong *)pGVar2;
                  pGVar18 = (Gia_Obj_t *)
                            (((ulong)((uint)(uVar10 >> 0x3d) & 1) |
                             (ulong)(pGVar2 + -(uVar10 >> 0x20 & 0x1fffffff))) ^ 1);
                  pGVar12 = pGVar2 + -(uVar10 & 0x1fffffff);
                  goto LAB_00712646;
                }
              }
              else {
                if (((uVar5 | uVar17) >> 0x1e & 1) != 0) {
                  __assert_fail("Cbs_VarIsJust(pVar)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                                ,0x312,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
                }
                iVar7 = (p->pJust).iHead;
                lVar8 = (long)iVar7;
                iVar1 = (p->pJust).iTail;
                if (iVar7 < iVar1) {
                  do {
                    pGVar12 = (p->pJust).pData[lVar8];
                    if (pGVar12 == (Gia_Obj_t *)0x0) break;
                    if (pGVar12 == pGVar2) {
                      __assert_fail("!Cbs_QueHasNode( &p->pJust, pVar )",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                                    ,0x313,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)")
                      ;
                    }
                    lVar8 = lVar8 + 1;
                  } while (iVar1 != lVar8);
                }
                iVar7 = (p->pJust).nSize;
                if ((p->pJust).iTail == iVar7) {
                  (p->pJust).nSize = iVar7 * 2;
                  ppGVar9 = (p->pJust).pData;
                  if (ppGVar9 == (Gia_Obj_t **)0x0) {
                    ppGVar9 = (Gia_Obj_t **)malloc((long)iVar7 << 4);
                  }
                  else {
                    ppGVar9 = (Gia_Obj_t **)realloc(ppGVar9,(long)iVar7 << 4);
                  }
                  (p->pJust).pData = ppGVar9;
                }
                iVar7 = (p->pJust).iTail;
                (p->pJust).iTail = iVar7 + 1;
                (p->pJust).pData[iVar7] = pGVar2;
              }
            }
          }
          else if (uVar19 != 0 && uVar14 != 0) {
            if ((uVar5 >> 0x1e & 1) == 0) {
              Cbs_ManAssign(p,(Gia_Obj_t *)((ulong)(uVar6 >> 0x1d & 1) | (ulong)pGVar12),Level,
                            pGVar2,(Gia_Obj_t *)0x0);
            }
            iVar15 = 0;
            if ((uVar17 >> 0x1e & 1) == 0) {
              uVar6 = (uint)((ulong)*(undefined8 *)pGVar2 >> 0x20);
              pGVar18 = (Gia_Obj_t *)
                        ((ulong)(uVar6 >> 0x1d & 1) | (ulong)(pGVar2 + -(ulong)(uVar6 & 0x1fffffff))
                        );
              pGVar12 = (Gia_Obj_t *)0x0;
LAB_00712646:
              Cbs_ManAssign(p,pGVar18,Level,pGVar2,pGVar12);
              iVar15 = 0;
            }
          }
          else {
            if (((uVar14 == 0) && (pGVar11 = pGVar12, uVar19 != 0)) ||
               ((uVar14 != 0 && (pGVar11 = pGVar18, uVar19 == 0)))) {
              pGVar18 = (Gia_Obj_t *)0x0;
              pGVar12 = pGVar11;
            }
            else if (uVar14 != 0 || uVar19 != 0) {
              __assert_fail("Value0 == 0 && Value1 == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                            ,0x2fc,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
            }
LAB_007126fc:
            iVar15 = Cbs_ManAnalyze(p,Level,pGVar2,pGVar12,pGVar18);
          }
        }
        if (iVar15 != 0) {
          return iVar15;
        }
        lVar16 = lVar16 + 1;
        uVar6 = (p->pProp).iTail;
        uVar10 = (ulong)(int)uVar6;
      } while (lVar16 < (long)uVar10);
    }
    (p->pProp).iHead = uVar6;
    iVar15 = (p->pJust).iHead;
    iVar7 = (p->pJust).iTail;
    if (iVar15 < iVar7) {
      lVar16 = (long)iVar15;
      ppGVar9 = (p->pJust).pData;
      pGVar2 = ppGVar9[lVar16];
      while (pGVar2 != (Gia_Obj_t *)0x0) {
        lVar16 = lVar16 + 1;
        uVar10 = *(ulong *)pGVar2;
        uVar6 = (uint)uVar10;
        uVar13 = uVar10 & 0x1fffffff;
        bVar3 = uVar13 == 0x1fffffff || (int)uVar6 < 0;
        uVar4 = (uint)(uVar10 >> 0x20);
        if (((bVar3) || ((pGVar2[-uVar13].field_0x3 & 0x40) != 0)) ||
           ((pGVar2[-(ulong)(uVar4 & 0x1fffffff)].field_0x3 & 0x40) != 0)) {
          if (((ulong)pGVar2 & 1) != 0) {
            __assert_fail("!Gia_IsComplement(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x326,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
          }
          if (bVar3) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x327,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
          }
          if (uVar6 < 0x40000000) {
            __assert_fail("Cbs_VarIsAssigned(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x328,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
          }
          if ((uVar6 >> 0x1e & 1) == 0) {
LAB_00712962:
            __assert_fail("pVar->fMark0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x5d,"int Cbs_VarValue(Gia_Obj_t *)");
          }
          if ((uVar10 & 0x4000000000000000) != 0) {
            __assert_fail("!Cbs_VarValue(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x329,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
          }
          uVar14 = ((uint)(uVar10 >> 0x1d) & 7 ^
                   (uint)((ulong)*(undefined8 *)(pGVar2 + -uVar13) >> 0x3e)) & 1;
          uVar5 = (uint)*(undefined8 *)(pGVar2 + -uVar13);
          if ((uVar5 >> 0x1e & 1) == 0) {
            uVar14 = 2;
          }
          uVar17 = (uint)*(undefined8 *)(pGVar2 + -(ulong)(uVar4 & 0x1fffffff));
          uVar19 = (uVar4 >> 0x1d ^
                   (uint)((ulong)*(undefined8 *)(pGVar2 + -(ulong)(uVar4 & 0x1fffffff)) >> 0x3e)) &
                   1;
          if ((uVar17 >> 0x1e & 1) == 0) {
            uVar19 = 2;
          }
          iVar7 = 0;
          if ((uVar14 != 0) && (uVar19 != 0)) {
            if ((uVar14 == 1) && (uVar19 == 1)) {
              iVar7 = Cbs_ManAnalyze(p,Level,pGVar2,pGVar2 + -uVar13,
                                     pGVar2 + -(ulong)(uVar4 & 0x1fffffff));
            }
            else {
              if ((uVar14 != 1) && (uVar19 != 1)) {
                __assert_fail("Value0 == 1 || Value1 == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                              ,0x331,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
              }
              if ((uVar5 >> 0x1e & 1) == 0) {
                Cbs_ManAssign(p,(Gia_Obj_t *)
                                (((ulong)(uVar6 >> 0x1d & 1) | (ulong)(pGVar2 + -uVar13)) ^ 1),Level
                              ,pGVar2,pGVar2 + -(ulong)(uVar4 & 0x1fffffff));
              }
              iVar7 = 0;
              if ((uVar17 >> 0x1e & 1) == 0) {
                uVar10 = *(ulong *)pGVar2;
                Cbs_ManAssign(p,(Gia_Obj_t *)
                                (((ulong)((uint)(uVar10 >> 0x3d) & 1) |
                                 (ulong)(pGVar2 + -(uVar10 >> 0x20 & 0x1fffffff))) ^ 1),Level,pGVar2
                              ,pGVar2 + -(uVar10 & 0x1fffffff));
              }
            }
          }
          if (iVar7 != 0) {
            return iVar7;
          }
        }
        else {
          lVar8 = (long)iVar15;
          iVar15 = iVar15 + 1;
          ppGVar9[lVar8] = pGVar2;
        }
        iVar7 = (p->pJust).iTail;
        if (iVar7 <= lVar16) break;
        ppGVar9 = (p->pJust).pData;
        pGVar2 = ppGVar9[lVar16];
      }
    }
    if (iVar15 == iVar7) {
      return 0;
    }
    (p->pJust).iTail = iVar15;
  } while( true );
}

Assistant:

int Cbs_ManPropagate( Cbs_Man_t * p, int Level )
{
    int hClause;
    Gia_Obj_t * pVar;
    int i, k;
    while ( 1 )
    {
        Cbs_QueForEachEntry( p->pProp, pVar, i )
        {
            if ( (hClause = Cbs_ManPropagateOne( p, pVar, Level )) )
                return hClause;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Cbs_QueForEachEntry( p->pJust, pVar, i )
        {
            if ( Cbs_VarIsJust( pVar ) )
                p->pJust.pData[k++] = pVar;
            else if ( (hClause = Cbs_ManPropagateTwo( p, pVar, Level )) )
                return hClause;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
    return 0;
}